

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest(FILE *out,UnitTest *unit_test)

{
  UnitTest *pUVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  TimeInMillis ms;
  undefined8 uVar6;
  TestCase *test_case;
  int local_3c;
  internal local_38 [4];
  int i;
  UnitTest *local_18;
  UnitTest *unit_test_local;
  FILE *out_local;
  
  local_18 = unit_test;
  unit_test_local = (UnitTest *)out;
  fprintf((FILE *)out,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  pUVar1 = unit_test_local;
  uVar2 = UnitTest::total_test_count(local_18);
  uVar3 = UnitTest::failed_test_count(local_18);
  uVar4 = UnitTest::disabled_test_count(local_18);
  ms = UnitTest::elapsed_time(local_18);
  FormatTimeInMillisAsSeconds_abi_cxx11_(local_38,ms);
  uVar6 = std::__cxx11::string::c_str();
  fprintf((FILE *)pUVar1,
          "<testsuites tests=\"%d\" failures=\"%d\" disabled=\"%d\" errors=\"0\" time=\"%s\" ",
          (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,uVar6);
  std::__cxx11::string::~string((string *)local_38);
  pUVar1 = unit_test_local;
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    uVar2 = UnitTest::random_seed(local_18);
    fprintf((FILE *)pUVar1,"random_seed=\"%d\" ",(ulong)uVar2);
  }
  fprintf((FILE *)unit_test_local,"name=\"AllTests\">\n");
  local_3c = 0;
  while( true ) {
    iVar5 = UnitTest::total_test_case_count(local_18);
    pUVar1 = unit_test_local;
    if (iVar5 <= local_3c) break;
    test_case = UnitTest::GetTestCase(local_18,local_3c);
    PrintXmlTestCase((FILE *)pUVar1,test_case);
    local_3c = local_3c + 1;
  }
  fprintf((FILE *)unit_test_local,"</testsuites>\n");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(FILE* out,
                                                const UnitTest& unit_test) {
  fprintf(out, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  fprintf(out,
          "<testsuites tests=\"%d\" failures=\"%d\" disabled=\"%d\" "
          "errors=\"0\" time=\"%s\" ",
          unit_test.total_test_count(),
          unit_test.failed_test_count(),
          unit_test.disabled_test_count(),
          FormatTimeInMillisAsSeconds(unit_test.elapsed_time()).c_str());
  if (GTEST_FLAG(shuffle)) {
    fprintf(out, "random_seed=\"%d\" ", unit_test.random_seed());
  }
  fprintf(out, "name=\"AllTests\">\n");
  for (int i = 0; i < unit_test.total_test_case_count(); ++i)
    PrintXmlTestCase(out, *unit_test.GetTestCase(i));
  fprintf(out, "</testsuites>\n");
}